

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O3

int hostkey_method_ssh_ecdsa_init
              (LIBSSH2_SESSION *session,uchar *hostkey_data,size_t hostkey_data_len,void **abstract)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  libssh2_curve_type curve;
  size_t len;
  uchar *domain;
  EC_KEY *ecdsactx;
  size_t key_len;
  uchar *public_key;
  uchar *type_str;
  string_buf buf;
  size_t local_78;
  uchar *local_70;
  EC_KEY *local_68;
  size_t local_60;
  uchar *local_58;
  uchar *local_50;
  string_buf local_48;
  
  local_68 = (EC_KEY *)0x0;
  if ((abstract != (void **)0x0) && ((EC_KEY *)*abstract != (EC_KEY *)0x0)) {
    EC_KEY_free((EC_KEY *)*abstract);
    *abstract = (void *)0x0;
  }
  iVar5 = -1;
  if (hostkey_data_len < 0x27) {
    return -1;
  }
  local_48.data = hostkey_data;
  local_48.dataptr = hostkey_data;
  local_48.len = hostkey_data_len;
  iVar3 = _libssh2_get_string(&local_48,&local_50,&local_78);
  if (iVar3 != 0) {
    return -1;
  }
  if (local_78 != 0x13) {
    return -1;
  }
  iVar3 = strncmp((char *)local_50,"ecdsa-sha2-nistp256",0x13);
  if (iVar3 == 0) {
    curve = LIBSSH2_EC_CURVE_NISTP256;
    bVar1 = false;
  }
  else {
    iVar4 = strncmp((char *)local_50,"ecdsa-sha2-nistp384",0x13);
    if (iVar4 != 0) {
      iVar4 = strncmp((char *)local_50,"ecdsa-sha2-nistp521",0x13);
      if (iVar4 != 0) {
        return -1;
      }
      curve = LIBSSH2_EC_CURVE_NISTP521;
      bVar2 = true;
      bVar1 = false;
      goto LAB_0010b220;
    }
    curve = LIBSSH2_EC_CURVE_NISTP384;
    bVar1 = true;
  }
  bVar2 = false;
LAB_0010b220:
  iVar4 = _libssh2_get_string(&local_48,&local_70,&local_78);
  if ((((((iVar4 == 0) && (local_78 == 8)) &&
        ((iVar3 != 0 || (iVar3 = strncmp((char *)local_70,"nistp256",8), iVar3 == 0)))) &&
       ((!bVar1 || (iVar3 = strncmp((char *)local_70,"nistp384",8), iVar3 == 0)))) &&
      ((!bVar2 || (iVar3 = strncmp((char *)local_70,"nistp521",8), iVar3 == 0)))) &&
     ((iVar3 = _libssh2_get_string(&local_48,&local_58,&local_60), iVar3 == 0 &&
      (iVar3 = _libssh2_eob(&local_48), iVar3 != 0)))) {
    iVar5 = _libssh2_ecdsa_curve_name_with_octal_new(&local_68,local_58,local_60,curve);
    if (abstract == (void **)0x0 || iVar5 != 0) {
      iVar5 = -(uint)(iVar5 != 0);
    }
    else {
      *abstract = local_68;
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

static int
hostkey_method_ssh_ecdsa_init(LIBSSH2_SESSION * session,
                              const unsigned char *hostkey_data,
                              size_t hostkey_data_len,
                              void **abstract)
{
    libssh2_ecdsa_ctx *ecdsactx = NULL;
    unsigned char *type_str, *domain, *public_key;
    size_t key_len, len;
    libssh2_curve_type type;
    struct string_buf buf;

    if(abstract && *abstract) {
        hostkey_method_ssh_ecdsa_dtor(session, abstract);
        *abstract = NULL;
    }

    if(hostkey_data_len < 39) {
        _libssh2_debug((session, LIBSSH2_TRACE_ERROR,
                       "host key length too short"));
        return -1;
    }

    buf.data = (unsigned char *)hostkey_data;
    buf.dataptr = buf.data;
    buf.len = hostkey_data_len;

    if(_libssh2_get_string(&buf, &type_str, &len) || len != 19)
        return -1;

    if(strncmp((char *) type_str, "ecdsa-sha2-nistp256", 19) == 0) {
        type = LIBSSH2_EC_CURVE_NISTP256;
    }
    else if(strncmp((char *) type_str, "ecdsa-sha2-nistp384", 19) == 0) {
        type = LIBSSH2_EC_CURVE_NISTP384;
    }
    else if(strncmp((char *) type_str, "ecdsa-sha2-nistp521", 19) == 0) {
        type = LIBSSH2_EC_CURVE_NISTP521;
    }
    else {
        return -1;
    }

    if(_libssh2_get_string(&buf, &domain, &len) || len != 8)
        return -1;

    if(type == LIBSSH2_EC_CURVE_NISTP256 &&
       strncmp((char *)domain, "nistp256", 8) != 0) {
        return -1;
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP384 &&
            strncmp((char *)domain, "nistp384", 8) != 0) {
        return -1;
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP521 &&
            strncmp((char *)domain, "nistp521", 8) != 0) {
        return -1;
    }

    /* public key */
    if(_libssh2_get_string(&buf, &public_key, &key_len))
        return -1;

    if(!_libssh2_eob(&buf))
        return -1;

    if(_libssh2_ecdsa_curve_name_with_octal_new(&ecdsactx, public_key,
                                                key_len, type))
        return -1;

    if(abstract)
        *abstract = ecdsactx;

    return 0;
}